

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::QuadMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRefMB *pPVar6;
  int iVar7;
  float fVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  size_t *psVar12;
  ulong uVar13;
  undefined4 uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint uVar25;
  float fVar26;
  uint uVar28;
  float fVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  float fVar35;
  undefined1 auVar31 [12];
  float fVar30;
  float fVar34;
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar33;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar40;
  float fVar44;
  undefined1 auVar45 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar46;
  undefined1 auVar47 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar48;
  float fVar49;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  float fVar55;
  float fVar59;
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  ulong local_128;
  unsigned_long local_118;
  size_t local_110;
  size_t local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar13 = r->_begin;
  uVar16 = r->_end;
  aVar52 = _DAT_01f7a9f0;
  aVar27 = _DAT_01f7aa00;
  aVar61 = _DAT_01f7a9f0;
  aVar63 = _DAT_01f7aa00;
  aVar64 = _DAT_01f7a9f0;
  if (uVar13 < uVar16) {
    fVar26 = 0.0;
    fVar29 = 1.0;
    fVar36 = 1.0;
    local_118 = 0;
    local_f8 = _DAT_01f7aa00;
    local_110 = 0;
    local_128 = 0;
    fVar30 = 0.0;
    local_108 = k;
    do {
      BVar2 = (this->super_QuadMesh).super_Geometry.time_range;
      fVar37 = BVar2.lower;
      fVar41 = BVar2.upper;
      fVar8 = (this->super_QuadMesh).super_Geometry.fnumTimeSegments;
      fVar22 = t0t1->lower;
      fVar23 = t0t1->upper;
      fVar20 = floorf(((fVar22 - fVar37) / (fVar41 - fVar37)) * 1.0000002 * fVar8);
      fVar21 = ceilf(((fVar23 - fVar37) / (fVar41 - fVar37)) * 0.99999976 * fVar8);
      lVar11 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      lVar10 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar13;
      uVar19 = (ulong)*(uint *)(lVar11 + lVar10);
      pBVar3 = (this->super_QuadMesh).vertices.items;
      uVar9 = (pBVar3->super_RawBufferView).num;
      if ((((uVar19 < uVar9) && (uVar18 = (ulong)*(uint *)(lVar11 + 4 + lVar10), uVar18 < uVar9)) &&
          (uVar17 = (ulong)*(uint *)(lVar11 + 8 + lVar10), uVar17 < uVar9)) &&
         (uVar15 = (ulong)*(uint *)(lVar11 + 0xc + lVar10), uVar15 < uVar9)) {
        fVar68 = 0.0;
        if (0.0 <= fVar20) {
          fVar68 = fVar20;
        }
        if (fVar8 <= fVar21) {
          fVar21 = fVar8;
        }
        if ((uint)(int)fVar68 <= (uint)(int)fVar21) {
          uVar9 = (ulong)(int)fVar68;
          psVar12 = &pBVar3[uVar9].super_RawBufferView.stride;
          do {
            pcVar4 = ((RawBufferView *)(psVar12 + -2))->ptr_ofs;
            sVar5 = *psVar12;
            pfVar1 = (float *)(pcVar4 + sVar5 * uVar19);
            auVar32._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar32._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar32._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar32._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar14 = movmskps((int)(sVar5 * uVar19),auVar32);
            if ((~(byte)uVar14 & 7) != 0) goto LAB_009854d6;
            pfVar1 = (float *)(pcVar4 + sVar5 * uVar18);
            auVar56._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar56._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar56._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar56._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar14 = movmskps((int)(sVar5 * uVar18),auVar56);
            if ((~(byte)uVar14 & 7) != 0) goto LAB_009854d6;
            pfVar1 = (float *)(pcVar4 + sVar5 * uVar17);
            auVar50._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar50._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar50._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar50._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar14 = movmskps((int)(sVar5 * uVar17),auVar50);
            if ((~(byte)uVar14 & 7) != 0) goto LAB_009854d6;
            pfVar1 = (float *)(pcVar4 + sVar5 * uVar15);
            auVar51._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar51._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar51._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar51._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar14 = movmskps((int)pcVar4,auVar51);
            if ((~(byte)uVar14 & 7) != 0) goto LAB_009854d6;
            uVar9 = uVar9 + 1;
            psVar12 = psVar12 + 7;
          } while (uVar9 <= (ulong)(long)(int)fVar21);
        }
        fVar68 = (fVar22 - fVar37) / (fVar41 - fVar37);
        fVar21 = (fVar23 - fVar37) / (fVar41 - fVar37);
        fVar20 = fVar8 * fVar21;
        fVar22 = floorf(fVar8 * fVar68);
        fVar23 = ceilf(fVar20);
        iVar7 = (int)fVar22;
        if (fVar22 <= 0.0) {
          fVar22 = 0.0;
        }
        fVar24 = fVar23;
        if (fVar8 <= fVar23) {
          fVar24 = fVar8;
        }
        if (iVar7 < 0) {
          iVar7 = -1;
        }
        uVar25 = (int)fVar8 + 1U;
        if ((int)fVar23 < (int)((int)fVar8 + 1U)) {
          uVar25 = (int)fVar23;
        }
        lVar11 = (long)(int)fVar22;
        pcVar4 = pBVar3[lVar11].super_RawBufferView.ptr_ofs;
        sVar5 = pBVar3[lVar11].super_RawBufferView.stride;
        auVar32 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
        auVar56 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
        auVar32 = minps(auVar32,auVar56);
        auVar50 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
        auVar56 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
        auVar51 = maxps(auVar50,auVar56);
        lVar10 = (long)(int)fVar24;
        pcVar4 = pBVar3[lVar10].super_RawBufferView.ptr_ofs;
        sVar5 = pBVar3[lVar10].super_RawBufferView.stride;
        auVar56 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
        auVar50 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
        auVar56 = minps(auVar56,auVar50);
        auVar57 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
        auVar50 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                        *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
        auVar50 = maxps(auVar57,auVar50);
        fVar22 = fVar8 * fVar68 - fVar22;
        fVar38 = auVar56._0_4_;
        fVar23 = auVar32._0_4_;
        fVar55 = auVar50._0_4_;
        fVar59 = auVar50._4_4_;
        fVar60 = auVar50._8_4_;
        fVar49 = auVar51._0_4_;
        fVar53 = auVar51._4_4_;
        fVar54 = auVar51._8_4_;
        fVar34 = auVar32._4_4_;
        fVar35 = auVar32._8_4_;
        fVar42 = auVar56._4_4_;
        fVar43 = auVar56._8_4_;
        if (uVar25 - iVar7 == 1) {
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar21 = 1.0 - fVar22;
          auVar31._4_4_ = fVar21 * fVar34 + fVar22 * fVar42;
          auVar31._0_4_ = fVar21 * fVar23 + fVar22 * fVar38;
          auVar45._0_4_ = fVar21 * fVar49 + fVar22 * fVar55;
          auVar45._4_4_ = fVar21 * fVar53 + fVar22 * fVar59;
          auVar45._8_4_ = fVar21 * fVar54 + fVar22 * fVar60;
          fVar8 = fVar24 - fVar20;
          if (fVar24 - fVar20 <= 0.0) {
            fVar8 = 0.0;
          }
          fVar20 = 1.0 - fVar8;
          auVar39._0_4_ = fVar38 * fVar20 + fVar23 * fVar8;
          auVar39._4_4_ = fVar42 * fVar20 + fVar34 * fVar8;
          auVar39._8_4_ = fVar43 * fVar20 + fVar35 * fVar8;
          auVar47._0_4_ = fVar20 * fVar55 + fVar8 * fVar49;
          auVar47._4_4_ = fVar20 * fVar59 + fVar8 * fVar53;
          auVar47._8_4_ = fVar20 * fVar60 + fVar8 * fVar54;
          auVar31._8_4_ = fVar21 * fVar35 + fVar22 * fVar43;
        }
        else {
          pcVar4 = pBVar3[lVar11 + 1].super_RawBufferView.ptr_ofs;
          sVar5 = pBVar3[lVar11 + 1].super_RawBufferView.stride;
          auVar57 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
          auVar65 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
          auVar62 = minps(auVar57,auVar65);
          auVar57 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
          auVar65 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
          auVar57 = maxps(auVar57,auVar65);
          pcVar4 = pBVar3[lVar10 + -1].super_RawBufferView.ptr_ofs;
          sVar5 = pBVar3[lVar10 + -1].super_RawBufferView.stride;
          auVar65 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
          auVar69 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
          auVar69 = minps(auVar65,auVar69);
          auVar65 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
          auVar66 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                          *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
          auVar65 = maxps(auVar65,auVar66);
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar44 = 1.0 - fVar22;
          auVar31._0_4_ = fVar23 * fVar44 + auVar62._0_4_ * fVar22;
          auVar31._4_4_ = fVar34 * fVar44 + auVar62._4_4_ * fVar22;
          auVar31._8_4_ = fVar35 * fVar44 + auVar62._8_4_ * fVar22;
          auVar62._12_4_ = auVar32._12_4_ * fVar44 + auVar62._12_4_ * fVar22;
          auVar62._0_12_ = auVar31;
          auVar45._0_4_ = fVar44 * fVar49 + fVar22 * auVar57._0_4_;
          auVar45._4_4_ = fVar44 * fVar53 + fVar22 * auVar57._4_4_;
          auVar45._8_4_ = fVar44 * fVar54 + fVar22 * auVar57._8_4_;
          auVar57._12_4_ = fVar44 * auVar51._12_4_ + fVar22 * auVar57._12_4_;
          auVar57._0_12_ = auVar45;
          fVar24 = fVar24 - fVar20;
          if (fVar24 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar22 = 1.0 - fVar24;
          auVar39._0_4_ = fVar38 * fVar22 + auVar69._0_4_ * fVar24;
          auVar39._4_4_ = fVar42 * fVar22 + auVar69._4_4_ * fVar24;
          auVar39._8_4_ = fVar43 * fVar22 + auVar69._8_4_ * fVar24;
          auVar69._12_4_ = auVar56._12_4_ * fVar22 + auVar69._12_4_ * fVar24;
          auVar69._0_12_ = auVar39;
          auVar47._0_4_ = fVar22 * fVar55 + fVar24 * auVar65._0_4_;
          auVar47._4_4_ = fVar22 * fVar59 + fVar24 * auVar65._4_4_;
          auVar47._8_4_ = fVar22 * fVar60 + fVar24 * auVar65._8_4_;
          auVar65._12_4_ = fVar22 * auVar50._12_4_ + fVar24 * auVar65._12_4_;
          auVar65._0_12_ = auVar47;
          uVar28 = iVar7 + 1;
          if ((int)uVar28 < (int)uVar25) {
            psVar12 = &pBVar3[uVar28].super_RawBufferView.stride;
            do {
              fVar23 = ((float)(int)uVar28 / fVar8 - fVar68) / (fVar21 - fVar68);
              fVar22 = 1.0 - fVar23;
              pcVar4 = ((RawBufferView *)(psVar12 + -2))->ptr_ofs;
              sVar5 = *psVar12;
              auVar32 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                              *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
              auVar56 = minps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                              *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
              auVar32 = minps(auVar32,auVar56);
              auVar67._0_4_ = auVar32._0_4_ - (auVar62._0_4_ * fVar22 + auVar69._0_4_ * fVar23);
              auVar67._4_4_ = auVar32._4_4_ - (auVar62._4_4_ * fVar22 + auVar69._4_4_ * fVar23);
              auVar67._8_4_ = auVar32._8_4_ - (auVar62._8_4_ * fVar22 + auVar69._8_4_ * fVar23);
              auVar67._12_4_ = auVar32._12_4_ - (auVar62._12_4_ * fVar22 + auVar69._12_4_ * fVar23);
              auVar32 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar19),
                              *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18));
              auVar56 = maxps(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),
                              *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar15));
              auVar32 = maxps(auVar32,auVar56);
              auVar66._0_4_ = auVar32._0_4_ - (fVar22 * auVar57._0_4_ + fVar23 * auVar65._0_4_);
              auVar66._4_4_ = auVar32._4_4_ - (fVar22 * auVar57._4_4_ + fVar23 * auVar65._4_4_);
              auVar66._8_4_ = auVar32._8_4_ - (fVar22 * auVar57._8_4_ + fVar23 * auVar65._8_4_);
              auVar66._12_4_ = auVar32._12_4_ - (fVar22 * auVar57._12_4_ + fVar23 * auVar65._12_4_);
              auVar32 = minps(auVar67,ZEXT816(0));
              auVar31._0_4_ = auVar62._0_4_ + auVar32._0_4_;
              auVar31._4_4_ = auVar62._4_4_ + auVar32._4_4_;
              auVar31._8_4_ = auVar62._8_4_ + auVar32._8_4_;
              auVar62._12_4_ = auVar62._12_4_ + auVar32._12_4_;
              auVar62._0_12_ = auVar31;
              auVar39._0_4_ = auVar69._0_4_ + auVar32._0_4_;
              auVar39._4_4_ = auVar69._4_4_ + auVar32._4_4_;
              auVar39._8_4_ = auVar69._8_4_ + auVar32._8_4_;
              auVar69._12_4_ = auVar69._12_4_ + auVar32._12_4_;
              auVar69._0_12_ = auVar39;
              auVar32 = maxps(auVar66,ZEXT816(0));
              auVar45._0_4_ = auVar57._0_4_ + auVar32._0_4_;
              auVar45._4_4_ = auVar57._4_4_ + auVar32._4_4_;
              auVar45._8_4_ = auVar57._8_4_ + auVar32._8_4_;
              auVar57._12_4_ = auVar57._12_4_ + auVar32._12_4_;
              auVar57._0_12_ = auVar45;
              auVar47._0_4_ = auVar65._0_4_ + auVar32._0_4_;
              auVar47._4_4_ = auVar65._4_4_ + auVar32._4_4_;
              auVar47._8_4_ = auVar65._8_4_ + auVar32._8_4_;
              auVar65._12_4_ = auVar65._12_4_ + auVar32._12_4_;
              auVar65._0_12_ = auVar47;
              uVar28 = uVar28 + 1;
              psVar12 = psVar12 + 7;
            } while (uVar25 != uVar28);
          }
        }
        fVar8 = (float)((this->super_QuadMesh).super_Geometry.numTimeSteps - 1);
        uVar9 = (ulong)(uint)fVar8;
        aVar33.m128[3] = (float)geomID;
        aVar33._0_12_ = auVar31;
        aVar46.m128[3] = (float)uVar13;
        aVar46._0_12_ = auVar45;
        aVar40.m128[3] = fVar8;
        aVar40._0_12_ = auVar39;
        aVar48.m128[3] = fVar8;
        aVar48._0_12_ = auVar47;
        auVar58._0_4_ =
             auVar45._0_4_ * 0.5 + auVar47._0_4_ * 0.5 + auVar31._0_4_ * 0.5 + auVar39._0_4_ * 0.5;
        auVar58._4_4_ =
             auVar45._4_4_ * 0.5 + auVar47._4_4_ * 0.5 + auVar31._4_4_ * 0.5 + auVar39._4_4_ * 0.5;
        auVar58._8_4_ =
             auVar45._8_4_ * 0.5 + auVar47._8_4_ * 0.5 + auVar31._8_4_ * 0.5 + auVar39._8_4_ * 0.5;
        auVar58._12_4_ = (float)uVar13 * 0.5 + fVar8 * 0.5 + (float)geomID * 0.5 + fVar8 * 0.5;
        aVar61.m128 = (__m128)minps(aVar61.m128,auVar58);
        aVar27.m128 = (__m128)maxps(aVar27.m128,auVar58);
        fVar8 = fVar41;
        if (fVar41 <= fVar30) {
          fVar8 = fVar30;
        }
        local_118 = local_118 + 1;
        local_110 = local_110 + uVar9;
        uVar25 = (int)((uint)(local_128 < uVar9) << 0x1f) >> 0x1f;
        uVar28 = (int)((uint)(local_128 < uVar9) << 0x1f) >> 0x1f;
        fVar26 = (float)(~uVar25 & (uint)fVar26 | (uint)fVar37 & uVar25);
        fVar29 = (float)(~uVar28 & (uint)fVar29 | (uint)fVar41 & uVar28);
        aVar52.m128 = (__m128)minps(aVar52.m128,aVar33.m128);
        if (local_128 <= uVar9) {
          local_128 = uVar9;
        }
        pPVar6 = prims->items;
        pPVar6[local_108].lbounds.bounds0.lower.field_0 = aVar33;
        local_f8.m128 = (__m128)maxps(local_f8.m128,aVar46.m128);
        pPVar6[local_108].lbounds.bounds0.upper.field_0 = aVar46;
        aVar64.m128 = (__m128)minps(aVar64.m128,aVar40.m128);
        pPVar6[local_108].lbounds.bounds1.lower.field_0 = aVar40;
        aVar63.m128 = (__m128)maxps(aVar63.m128,aVar48.m128);
        pPVar6[local_108].lbounds.bounds1.upper.field_0 = aVar48;
        if (fVar37 <= fVar36) {
          fVar36 = fVar37;
        }
        pPVar6[local_108].time_range.lower = fVar37;
        pPVar6[local_108].time_range.upper = fVar41;
        local_108 = local_108 + 1;
        uVar16 = r->_end;
        fVar30 = fVar8;
      }
LAB_009854d6:
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar16);
    (__return_storage_ptr__->object_range)._end = local_118;
  }
  else {
    fVar26 = 0.0;
    fVar29 = 1.0;
    fVar36 = 1.0;
    fVar30 = 0.0;
    local_128 = 0;
    local_110 = 0;
    local_f8 = _DAT_01f7aa00;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar52;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_f8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar64;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar61;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar27;
  (__return_storage_ptr__->time_range).lower = fVar36;
  (__return_storage_ptr__->time_range).upper = fVar30;
  __return_storage_ptr__->num_time_segments = local_110;
  __return_storage_ptr__->max_num_time_segments = local_128;
  (__return_storage_ptr__->max_time_range).lower = fVar26;
  (__return_storage_ptr__->max_time_range).upper = fVar29;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }